

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O2

bool __thiscall QLayout::setAlignment(QLayout *this,QWidget *w,Alignment alignment)

{
  int iVar1;
  QLayoutItem *this_00;
  undefined4 extraout_var;
  int i;
  int iVar2;
  
  iVar2 = 0;
  do {
    this_00 = (QLayoutItem *)(**(code **)(*(long *)this + 0xa8))(this,iVar2);
    if (this_00 == (QLayoutItem *)0x0) goto LAB_002e2f26;
    iVar1 = (*this_00->_vptr_QLayoutItem[0xd])(this_00);
    iVar2 = iVar2 + 1;
  } while ((QWidget *)CONCAT44(extraout_var,iVar1) != w);
  QLayoutItem::setAlignment(this_00,alignment);
  (**(code **)(*(long *)this + 0x70))(this);
LAB_002e2f26:
  return this_00 != (QLayoutItem *)0x0;
}

Assistant:

bool QLayout::setAlignment(QWidget *w, Qt::Alignment alignment)
{
    int i = 0;
    QLayoutItem *item = itemAt(i);
    while (item) {
        if (item->widget() == w) {
            item->setAlignment(alignment);
            invalidate();
            return true;
        }
        ++i;
        item = itemAt(i);
    }
    return false;
}